

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string code;
  LParser parser;
  undefined1 local_80 [48];
  LParser local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_80 + 0x10),
             "if b == (a + c)(b 1 2) then\n   if d == e then       d = 1\n   end\nelse\n   a = 23\nend\nbreak\n"
             ,(allocator<char> *)&local_50);
  std::make_unique<LStringLexer,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  local_80._8_8_ = local_80._0_8_;
  local_80._0_8_ = (long *)0x0;
  LParser::LParser(&local_50,(unique_ptr<LLexer,_std::default_delete<LLexer>_> *)(local_80 + 8));
  if ((long *)local_80._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_80._8_8_ + 8))();
  }
  local_80._8_8_ = 0;
  if ((long *)local_80._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_80._0_8_ + 8))();
  }
  LParser::parse(&local_50);
  LParser::~LParser(&local_50);
  std::__cxx11::string::~string((string *)(local_80 + 0x10));
  return 0;
}

Assistant:

int main() {
    std::string code =
            "if b == (a + c)(b 1 2) then\n"
            "   if d == e then"
            "       d = 1\n"
            "   end\n"
            "else\n"
            "   a = 23\n"
            "end\n"
            "break\n";
    auto parser = LParser(std::make_unique<LStringLexer>(code));
    parser.parse();
    return 0;
}